

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_3_2::SampleCountChannel::set(SampleCountChannel *this,int r,uint *newNumSamples)

{
  int iVar1;
  ImageLevel *pIVar2;
  ImageChannel *in_RDI;
  int i;
  int y;
  int x;
  uint in_stack_000000c4;
  int in_stack_000000c8;
  int in_stack_000000cc;
  SampleCountChannel *in_stack_000000d0;
  undefined4 local_24;
  
  pIVar2 = ImageChannel::level(in_RDI);
  ImageLevel::dataWindow(pIVar2);
  pIVar2 = ImageChannel::level(in_RDI);
  ImageLevel::dataWindow(pIVar2);
  local_24 = 0;
  while( true ) {
    iVar1 = ImageChannel::pixelsPerRow(in_RDI);
    if (iVar1 <= local_24) break;
    set(in_stack_000000d0,in_stack_000000cc,in_stack_000000c8,in_stack_000000c4);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int r, unsigned int newNumSamples[])
{
    int x = level ().dataWindow ().min.x;
    int y = r + level ().dataWindow ().min.x;

    for (int i = 0; i < pixelsPerRow (); ++i, ++x)
        set (x, y, newNumSamples[i]);
}